

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemTable.cpp
# Opt level: O3

void __thiscall ItemTable::BlueRoomTwo(ItemTable *this)

{
  ItemWrapper *this_00;
  ItemWrapper *this_01;
  ItemWrapper *this_02;
  mapped_type *ppIVar1;
  key_type local_104;
  string local_100;
  string local_e0;
  string local_c0;
  Item local_a0;
  Item local_78;
  Item local_50;
  
  this_00 = (ItemWrapper *)operator_new(0x58);
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"BabbleFish","");
  Item::Item(&local_50,&local_c0,FISH);
  ItemWrapper::ItemWrapper(this_00,&local_50,HIDDEN);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.name._M_dataplus._M_p != &local_50.name.field_2) {
    operator_delete(local_50.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  this_01 = (ItemWrapper *)operator_new(0x58);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Ceiling","");
  Item::Item(&local_78,&local_e0,CEILING);
  ItemWrapper::ItemWrapper(this_01,&local_78,B_ROOM2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.name._M_dataplus._M_p != &local_78.name.field_2) {
    operator_delete(local_78.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  this_02 = (ItemWrapper *)operator_new(0x58);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"Glyphs","");
  Item::Item(&local_a0,&local_100,GLYPHS);
  ItemWrapper::ItemWrapper(this_02,&local_a0,B_ROOM2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.name._M_dataplus._M_p != &local_a0.name.field_2) {
    operator_delete(local_a0.name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p);
  }
  local_104 = FISH;
  ppIVar1 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_104);
  *ppIVar1 = this_00;
  local_104 = CEILING;
  ppIVar1 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_104);
  *ppIVar1 = this_01;
  local_104 = GLYPHS;
  ppIVar1 = std::
            map<itemType,_ItemWrapper_*,_std::less<itemType>,_std::allocator<std::pair<const_itemType,_ItemWrapper_*>_>_>
            ::operator[](&this->items,&local_104);
  *ppIVar1 = this_02;
  return;
}

Assistant:

void ItemTable::BlueRoomTwo() {

    ItemWrapper * BabbleFish    = new ItemWrapper(Item("BabbleFish", FISH), HIDDEN);
    ItemWrapper * Ceiling       = new ItemWrapper(Item("Ceiling", CEILING), B_ROOM2);
    ItemWrapper * Glpyhs        = new ItemWrapper(Item("Glyphs", GLYPHS), B_ROOM2);

    items[FISH] = BabbleFish;
    items[CEILING] = Ceiling;
    items[GLYPHS] = Glpyhs;
}